

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.h
# Opt level: O0

void __thiscall EndPoint::EndPoint(EndPoint *this,int _id)

{
  int _id_local;
  EndPoint *this_local;
  
  this->id = _id;
  std::vector<Cache_*,_std::allocator<Cache_*>_>::vector(&this->caches);
  std::vector<int,_std::allocator<int>_>::vector(&this->caches_id);
  std::
  unordered_map<Cache_*,_int,_std::hash<Cache_*>,_std::equal_to<Cache_*>,_std::allocator<std::pair<Cache_*const,_int>_>_>
  ::unordered_map(&this->latency_to);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map(&this->latency_to_id);
  std::vector<Request_*,_std::allocator<Request_*>_>::vector(&this->requests);
  std::vector<int,_std::allocator<int>_>::vector(&this->requests_id);
  return;
}

Assistant:

EndPoint(int _id) : id(_id) {}